

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indonesia.h
# Opt level: O2

void __thiscall Maluku::resize(Maluku *this,float skala)

{
  double dVar1;
  
  dVar1 = (double)skala;
  Polygon::resize(dVar1,&this->halmahera->super_Polygon);
  Polygon::resize(dVar1,&this->ambon->super_Polygon);
  Polygon::resize(dVar1,&this->seram->super_Polygon);
  return;
}

Assistant:

void resize(float skala){
      halmahera->resize(skala,Point<double>(tengah_A,tengah_B));
      ambon->resize(skala,Point<double>(tengah_A,tengah_B));
      seram->resize(skala,Point<double>(tengah_A,tengah_B));
      
    
    }